

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

void VScaleBy_Serial(realtype a,N_Vector x)

{
  int iVar1;
  long lVar2;
  realtype *xd;
  sunindextype N;
  sunindextype i;
  N_Vector x_local;
  realtype a_local;
  
  iVar1 = *x->content;
  lVar2 = *(long *)((long)x->content + 8);
  for (i = 0; i < iVar1; i = i + 1) {
    *(double *)(lVar2 + (long)i * 8) = a * *(double *)(lVar2 + (long)i * 8);
  }
  return;
}

Assistant:

static void VScaleBy_Serial(realtype a, N_Vector x)
{
  sunindextype i, N;
  realtype *xd;

  xd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);

  for (i = 0; i < N; i++)
    xd[i] *= a;

  return;
}